

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_INT local_54;
  REF_INT local_50;
  int local_4c;
  int local_48;
  int local_44;
  REF_INT test_node;
  REF_INT search_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  *allowed = 0;
  pRVar2 = ref_grid->cell[3];
  if ((node0 < 0) || (pRVar2->ref_adj->nnode <= node0)) {
    local_4c = -1;
  }
  else {
    local_4c = pRVar2->ref_adj->first[node0];
  }
  search_node = local_4c;
  if (local_4c == -1) {
    local_50 = -1;
  }
  else {
    local_50 = pRVar2->ref_adj->item[local_4c].ref;
  }
  test_node = local_50;
  do {
    if (search_node == -1) {
      *allowed = 1;
      return 0;
    }
    for (local_44 = 0; local_44 < pRVar2->node_per; local_44 = local_44 + 1) {
      if (node1 == pRVar2->c2n[local_44 + pRVar2->size_per * test_node]) {
        for (local_48 = 0; local_48 < pRVar2->node_per; local_48 = local_48 + 1) {
          if (pRVar1->ref_mpi->id !=
              pRVar1->part[pRVar2->c2n[local_48 + pRVar2->size_per * test_node]]) {
            return 0;
          }
        }
      }
    }
    search_node = pRVar2->ref_adj->item[search_node].next;
    if (search_node == -1) {
      local_54 = -1;
    }
    else {
      local_54 = pRVar2->ref_adj->item[search_node].ref;
    }
    test_node = local_54;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_swap_local_cell(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, search_node, test_node;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}